

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

IntRect __thiscall sf::Font::findGlyphRect(Font *this,Page *page,uint width,uint height)

{
  Texture *this_00;
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  Vector2u VVar5;
  Vector2u VVar6;
  ostream *poVar7;
  undefined8 uVar8;
  pointer pRVar9;
  undefined8 uVar10;
  pointer pRVar11;
  uint height_00;
  float fVar12;
  IntRect IVar13;
  Texture newTexture;
  
  this_00 = &page->texture;
  fVar2 = 0.0;
  pRVar9 = (pointer)0x0;
  for (pRVar11 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pRVar9 == (pointer)0x0 &&
      (pRVar11 !=
       (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>._M_impl.
       super__Vector_impl_data._M_finish)); pRVar11 = pRVar11 + 1) {
    fVar12 = (float)height / (float)pRVar11->height;
    if ((fVar12 < 0.7) || (1.0 < fVar12)) {
      pRVar9 = (pointer)0x0;
    }
    else {
      VVar5 = Texture::getSize(this_00);
      if (VVar5.x - pRVar11->width < width) {
        pRVar9 = (pointer)0x0;
      }
      else {
        pRVar9 = (pointer)0x0;
        if (fVar2 <= fVar12) {
          pRVar9 = pRVar11;
          fVar2 = fVar12;
        }
      }
    }
  }
  if (pRVar9 == (pointer)0x0) {
    uVar3 = height / 10 + height;
    while( true ) {
      uVar1 = page->nextRow;
      VVar5 = Texture::getSize(this_00);
      if (uVar1 + uVar3 < VVar5.y) {
        VVar5 = Texture::getSize(this_00);
        if (width < VVar5.x) {
          newTexture.m_size.y = page->nextRow;
          newTexture.m_size.x = 0;
          newTexture.m_actualSize.x = uVar3;
          std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::emplace_back<sf::Font::Row>
                    (&page->rows,(Row *)&newTexture);
          page->nextRow = page->nextRow + uVar3;
          pRVar9 = (page->rows).super__Vector_base<sf::Font::Row,_std::allocator<sf::Font::Row>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
          goto LAB_001a2236;
        }
      }
      VVar5 = Texture::getSize(this_00);
      VVar6 = Texture::getSize(this_00);
      uVar1 = VVar5.x * 2;
      uVar4 = Texture::getMaximumSize();
      if (uVar4 < uVar1) break;
      height_00 = (uint)((ulong)VVar6 >> 0x1f) & 0xfffffffe;
      uVar4 = Texture::getMaximumSize();
      if (uVar4 < height_00) break;
      Texture::Texture(&newTexture);
      Texture::create(&newTexture,uVar1,height_00);
      Texture::setSmooth(&newTexture,this->m_isSmooth);
      Texture::update(&newTexture,this_00);
      Texture::swap(this_00,&newTexture);
      Texture::~Texture(&newTexture);
    }
    poVar7 = err();
    poVar7 = std::operator<<(poVar7,
                             "Failed to add a new character to the font: the maximum texture size has been reached"
                            );
    std::endl<char,std::char_traits<char>>(poVar7);
    uVar10 = 0x200000002;
    uVar8 = 0;
  }
  else {
LAB_001a2236:
    uVar8._0_4_ = pRVar9->width;
    uVar8._4_4_ = pRVar9->top;
    pRVar9->width = (undefined4)uVar8 + width;
    uVar10 = CONCAT44(height,width);
  }
  IVar13.width = (int)uVar10;
  IVar13.height = (int)((ulong)uVar10 >> 0x20);
  IVar13.left = (int)uVar8;
  IVar13.top = (int)((ulong)uVar8 >> 0x20);
  return IVar13;
}

Assistant:

IntRect Font::findGlyphRect(Page& page, unsigned int width, unsigned int height) const
{
    // Find the line that fits well the glyph
    Row* row = NULL;
    float bestRatio = 0;
    for (std::vector<Row>::iterator it = page.rows.begin(); it != page.rows.end() && !row; ++it)
    {
        float ratio = static_cast<float>(height) / static_cast<float>(it->height);

        // Ignore rows that are either too small or too high
        if ((ratio < 0.7f) || (ratio > 1.f))
            continue;

        // Check if there's enough horizontal space left in the row
        if (width > page.texture.getSize().x - it->width)
            continue;

        // Make sure that this new row is the best found so far
        if (ratio < bestRatio)
            continue;

        // The current row passed all the tests: we can select it
        row = &*it;
        bestRatio = ratio;
    }

    // If we didn't find a matching row, create a new one (10% taller than the glyph)
    if (!row)
    {
        unsigned int rowHeight = height + height / 10;
        while ((page.nextRow + rowHeight >= page.texture.getSize().y) || (width >= page.texture.getSize().x))
        {
            // Not enough space: resize the texture if possible
            unsigned int textureWidth  = page.texture.getSize().x;
            unsigned int textureHeight = page.texture.getSize().y;
            if ((textureWidth * 2 <= Texture::getMaximumSize()) && (textureHeight * 2 <= Texture::getMaximumSize()))
            {
                // Make the texture 2 times bigger
                Texture newTexture;
                newTexture.create(textureWidth * 2, textureHeight * 2);
                newTexture.setSmooth(m_isSmooth);
                newTexture.update(page.texture);
                page.texture.swap(newTexture);
            }
            else
            {
                // Oops, we've reached the maximum texture size...
                err() << "Failed to add a new character to the font: the maximum texture size has been reached" << std::endl;
                return IntRect(0, 0, 2, 2);
            }
        }

        // We can now create the new row
        page.rows.push_back(Row(page.nextRow, rowHeight));
        page.nextRow += rowHeight;
        row = &page.rows.back();
    }

    // Find the glyph's rectangle on the selected row
    IntRect rect(Rect<unsigned int>(row->width, row->top, width, height));

    // Update the row informations
    row->width += width;

    return rect;
}